

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void duckdb_je_arena_reset(tsd_t *tsd,arena_t *arena)

{
  void *pvVar1;
  pa_shard_t *in_RSI;
  uintptr_t in_RDI;
  rtree_metadata_t rVar2;
  uint j;
  uint i;
  emap_alloc_ctx_t alloc_ctx;
  size_t usize;
  void *ptr;
  edata_t *edata;
  rtree_metadata_t metadata;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  size_t ret;
  uint8_t state;
  edata_t *in_stack_fffffffffffffd50;
  pa_shard_t *in_stack_fffffffffffffd58;
  uint in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  uint uVar3;
  uint in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  edata_t *local_280;
  uint binind;
  undefined4 in_stack_fffffffffffffd98;
  uint in_stack_fffffffffffffd9c;
  rtree_t *in_stack_fffffffffffffda0;
  tsdn_t *in_stack_fffffffffffffda8;
  szind_t local_214;
  _Bool _Stack_20b;
  rtree_ctx_t local_200;
  szind_t *local_80;
  void *local_78;
  emap_t *local_70;
  size_t local_60;
  rtree_ctx_t *local_50;
  rtree_ctx_t *local_40;
  undefined1 local_19;
  
  malloc_mutex_lock((tsdn_t *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                    (malloc_mutex_t *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60))
  ;
  local_280 = edata_list_active_first
                        ((edata_list_active_t *)
                         &(in_RSI->pac).ecache_dirty.guarded_eset.bins[0x14].heap_min.addr);
  while (local_280 != (edata_t *)0x0) {
    pvVar1 = edata_base_get(local_280);
    malloc_mutex_unlock((tsdn_t *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                        (malloc_mutex_t *)in_stack_fffffffffffffd58);
    local_70 = &duckdb_je_arena_emap_global;
    local_80 = (szind_t *)&stack0xfffffffffffffd68;
    local_50 = &local_200;
    local_78 = pvVar1;
    if (in_RDI == 0) {
      duckdb_je_rtree_ctx_data_init(local_50);
      local_40 = local_50;
    }
    else {
      local_19 = *(undefined1 *)(in_RDI + 0x338);
      local_40 = (rtree_ctx_t *)(in_RDI + 0x1b8);
    }
    rVar2 = rtree_metadata_read(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                                (rtree_ctx_t *)
                                CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),in_RDI
                               );
    local_214 = rVar2.szind;
    *local_80 = local_214;
    _Stack_20b = rVar2.slab;
    *(byte *)(local_80 + 1) = _Stack_20b & 1;
    local_60 = duckdb_je_sz_index2size_tab[in_stack_fffffffffffffd68];
    in_stack_fffffffffffffd9c = in_stack_fffffffffffffd68;
    duckdb_je_large_dalloc((tsdn_t *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    malloc_mutex_lock((tsdn_t *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                      (malloc_mutex_t *)
                      CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    local_280 = edata_list_active_first
                          ((edata_list_active_t *)
                           &(in_RSI->pac).ecache_dirty.guarded_eset.bins[0x14].heap_min.addr);
  }
  malloc_mutex_unlock((tsdn_t *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                      (malloc_mutex_t *)in_stack_fffffffffffffd58);
  for (uVar3 = 0; uVar3 < 0x24; uVar3 = uVar3 + 1) {
    for (in_stack_fffffffffffffd60 = 0; binind = (uint)(in_RDI >> 0x20),
        in_stack_fffffffffffffd60 < duckdb_je_bin_infos[uVar3].n_shards;
        in_stack_fffffffffffffd60 = in_stack_fffffffffffffd60 + 1) {
      in_stack_fffffffffffffd58 = in_RSI;
      arena_get_bin((arena_t *)CONCAT44(uVar3,in_stack_fffffffffffffd60),
                    (szind_t)((ulong)in_RSI >> 0x20),(uint)in_RSI);
      arena_bin_reset((tsd_t *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                      (arena_t *)CONCAT44(uVar3,in_stack_fffffffffffffd60),
                      (bin_t *)in_stack_fffffffffffffd58,binind);
    }
  }
  duckdb_je_pa_shard_reset
            ((tsdn_t *)CONCAT44(uVar3,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58);
  return;
}

Assistant:

void
arena_reset(tsd_t *tsd, arena_t *arena) {
	/*
	 * Locking in this function is unintuitive.  The caller guarantees that
	 * no concurrent operations are happening in this arena, but there are
	 * still reasons that some locking is necessary:
	 *
	 * - Some of the functions in the transitive closure of calls assume
	 *   appropriate locks are held, and in some cases these locks are
	 *   temporarily dropped to avoid lock order reversal or deadlock due to
	 *   reentry.
	 * - mallctl("epoch", ...) may concurrently refresh stats.  While
	 *   strictly speaking this is a "concurrent operation", disallowing
	 *   stats refreshes would impose an inconvenient burden.
	 */

	/* Large allocations. */
	malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);

	for (edata_t *edata = edata_list_active_first(&arena->large);
	    edata != NULL; edata = edata_list_active_first(&arena->large)) {
		void *ptr = edata_base_get(edata);
		size_t usize;

		malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);
		emap_alloc_ctx_t alloc_ctx;
		emap_alloc_ctx_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
		    &alloc_ctx);
		assert(alloc_ctx.szind != SC_NSIZES);

		if (config_stats || (config_prof && opt_prof)) {
			usize = sz_index2size(alloc_ctx.szind);
			assert(usize == isalloc(tsd_tsdn(tsd), ptr));
		}
		/* Remove large allocation from prof sample set. */
		if (config_prof && opt_prof) {
			prof_free(tsd, ptr, usize, &alloc_ctx);
		}
		if (config_prof && opt_prof && alloc_ctx.szind < SC_NBINS) {
			arena_dalloc_promoted_impl(tsd_tsdn(tsd), ptr,
			    /* tcache */ NULL, /* slow_path */ true, edata);
		} else {
			large_dalloc(tsd_tsdn(tsd), edata);
		}
		malloc_mutex_lock(tsd_tsdn(tsd), &arena->large_mtx);
	}
	malloc_mutex_unlock(tsd_tsdn(tsd), &arena->large_mtx);

	/* Bins. */
	for (unsigned i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			arena_bin_reset(tsd, arena, arena_get_bin(arena, i, j),
			    i);
		}
	}
	pa_shard_reset(tsd_tsdn(tsd), &arena->pa_shard);
}